

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O0

void * mapObject(dsCrate *crate,uint64_t offset,uint64_t length)

{
  uint64_t length_local;
  uint64_t offset_local;
  dsCrate *crate_local;
  
  if (crate == (dsCrate *)0x0) {
    dsRunLogCallback("%s(): Bad argument %p\n","mapObject",0);
  }
  else {
    if (((crate->map).offset <= offset) &&
       (offset + length <= (crate->map).offset + (crate->map).length)) {
      return (void *)((long)(crate->map).ptr + offset);
    }
    dsRunLogCallback("%s(): Can\'t map region outside of crate.\n","mapObject");
  }
  return (void *)0x0;
}

Assistant:

static void *
mapObject(dsCrate *crate, uint64_t offset, uint64_t length)
{
	if (crate == NULL) {
		dsLog("Bad argument %p\n", crate);
		return NULL;
	}

	if ((offset < crate->map.offset) ||
		(offset + length > crate->map.offset + crate->map.length)) {
		dsLog("Can't map region outside of crate.\n");
		return NULL;
	}

	return crate->map.ptr + offset;
}